

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::tydra::anon_unknown_6::GetPrimProperty<tinyusdz::GeomSubset>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,GeomSubset *subset,string *prop_name,Property *out_prop)

{
  bool bVar1;
  pointer ppVar2;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
  *value;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
  *value_00;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
  *value_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool local_78a;
  bool local_789;
  _Self local_788;
  _Self local_780;
  const_iterator it;
  Property local_770;
  value_type *local_190;
  Relationship *rel;
  string local_180 [32];
  string local_160;
  undefined1 local_140 [40];
  string local_118 [32];
  string local_f8;
  undefined1 local_d8 [40];
  string local_b0 [32];
  string local_90;
  undefined1 local_70 [32];
  undefined1 local_50 [8];
  string err;
  Property *out_prop_local;
  string *prop_name_local;
  GeomSubset *subset_local;
  
  if (out_prop == (Property *)0x0) {
    err.field_2._8_8_ =
         nonstd::expected_lite::make_unexpected<char_const(&)[59]>
                   ((char (*) [59])"[InternalError] nullptr in output Property is not allowed.");
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>
              (__return_storage_ptr__,(unexpected_type<const_char_*> *)((long)&err.field_2 + 8));
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string((string *)local_50);
  bVar1 = ::std::operator==(prop_name,"indices");
  if ((!bVar1) ||
     (bVar1 = (anonymous_namespace)::ToProperty<std::vector<int,std::allocator<int>>>
                        (&subset->indices,out_prop,(string *)local_50), bVar1)) {
    bVar1 = ::std::operator==(prop_name,"elementType");
    if ((!bVar1) ||
       (bVar1 = ToTokenProperty<tinyusdz::GeomSubset::ElementType>
                          (&subset->elementType,out_prop,(string *)local_50), bVar1)) {
      bVar1 = ::std::operator==(prop_name,"familyName");
      if ((!bVar1) ||
         (bVar1 = ToProperty<tinyusdz::Token>(&subset->familyName,out_prop,(string *)local_50),
         bVar1)) {
        bVar1 = ::std::operator==(prop_name,"material:binding");
        if (bVar1) {
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)subset);
          if (!bVar1) {
            it._M_node._7_1_ = 0;
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::expected<bool,_0>(__return_storage_ptr__,(bool *)((long)&it._M_node + 7));
            goto LAB_004a5dc4;
          }
          local_190 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                                ((optional<tinyusdz::Relationship> *)subset);
          Property::Property(&local_770,local_190,false);
          Property::operator=(out_prop,&local_770);
          Property::~Property(&local_770);
        }
        else {
          local_780._M_node =
               (_Base_ptr)
               ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *)&subset->props,prop_name);
          local_788._M_node =
               (_Base_ptr)
               ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)&subset->props);
          bVar1 = ::std::operator==(&local_780,&local_788);
          if (bVar1) {
            local_789 = false;
            nonstd::expected_lite::
            expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::expected<bool,_0>(__return_storage_ptr__,&local_789);
            goto LAB_004a5dc4;
          }
          ppVar2 = ::std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
                   ::operator->(&local_780);
          Property::operator=(out_prop,&ppVar2->second);
        }
        local_78a = true;
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::expected<bool,_0>(__return_storage_ptr__,&local_78a);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_180,"Convert Property {} failed: {}\n",(allocator *)((long)&rel + 7));
        fmt::format<char[11],std::__cxx11::string>
                  (&local_160,(fmt *)local_180,(string *)"familyName",(char (*) [11])local_50,in_R8)
        ;
        nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                  ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_140,(expected_lite *)&local_160,value_01);
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (__return_storage_ptr__,
                   (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_140);
        nonstd::expected_lite::
        unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_140);
        ::std::__cxx11::string::~string((string *)&local_160);
        ::std::__cxx11::string::~string(local_180);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&rel + 7));
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_118,"Convert Property {} failed: {}\n",(allocator *)(local_140 + 0x27));
      fmt::format<char[12],std::__cxx11::string>
                (&local_f8,(fmt *)local_118,(string *)"elementType",(char (*) [12])local_50,in_R8);
      nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_d8,(expected_lite *)&local_f8,value_00);
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_d8);
      nonstd::expected_lite::
      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_d8);
      ::std::__cxx11::string::~string((string *)&local_f8);
      ::std::__cxx11::string::~string(local_118);
      ::std::allocator<char>::~allocator((allocator<char> *)(local_140 + 0x27));
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_b0,"Convert Property {} failed: {}\n",(allocator *)(local_d8 + 0x27));
    fmt::format<char[8],std::__cxx11::string>
              (&local_90,(fmt *)local_b0,(string *)0x64a4fb,(char (*) [8])local_50,in_R8);
    nonstd::expected_lite::make_unexpected<std::__cxx11::string>
              ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70,(expected_lite *)&local_90,value);
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,
               (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70);
    nonstd::expected_lite::
    unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string(local_b0);
    ::std::allocator<char>::~allocator((allocator<char> *)(local_d8 + 0x27));
  }
LAB_004a5dc4:
  local_d8._32_4_ = 1;
  ::std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> GetPrimProperty(
    const GeomSubset &subset, const std::string &prop_name,
    Property *out_prop) {
  if (!out_prop) {
    return nonstd::make_unexpected(
        "[InternalError] nullptr in output Property is not allowed.");
  }

  // Currently GeomSubset does not support TimeSamples and AttributeMeta

  std::string err;

  DCOUT("prop_name = " << prop_name);
  TO_PROPERTY("indices", subset.indices);
  TO_TOKEN_PROPERTY("elementType", subset.elementType);
  // TO_TOKEN_PROPERTY("familyType", subset.familyType);
  TO_PROPERTY("familyName", subset.familyName);

  if (prop_name == "material:binding") {
    if (subset.materialBinding) {
      const Relationship &rel = subset.materialBinding.value();
      (*out_prop) = Property(rel, /* custom */ false);
    } else {
      return false;
    }
  } else {
    const auto it = subset.props.find(prop_name);
    if (it == subset.props.end()) {
      // Attribute not found.
      return false;
    }

    (*out_prop) = it->second;
  }

  DCOUT("Prop found: " << prop_name
                       << ", ty = " << out_prop->value_type_name());
  return true;
}